

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

void __thiscall capnp::_::OrphanBuilder::euthanize(OrphanBuilder *this)

{
  Exception *_e3887;
  
  if (((this->tag).content & 2) == 0) {
    WireHelpers::zeroObject(this->segment,this->capTable,(WirePointer *)this,this->location);
  }
  else {
    WireHelpers::zeroObject(this->segment,this->capTable,(WirePointer *)this);
  }
  this->location = (word *)0x0;
  (this->tag).content = 0;
  this->segment = (SegmentBuilder *)0x0;
  return;
}

Assistant:

void OrphanBuilder::euthanize() {
  // Carefully catch any exceptions and rethrow them as recoverable exceptions since we may be in
  // a destructor.
  auto exception = kj::runCatchingExceptions([&]() {
    if (tagAsPtr()->isPositional()) {
      WireHelpers::zeroObject(segment, capTable, tagAsPtr(), location);
    } else {
      WireHelpers::zeroObject(segment, capTable, tagAsPtr());
    }

    WireHelpers::zeroMemory(&tag, ONE * WORDS);
    segment = nullptr;
    location = nullptr;
  });

  KJ_IF_SOME(e, exception) {
    kj::getExceptionCallback().onRecoverableException(kj::mv(e));
  }
}